

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

iterator __thiscall
phmap::priv::
btree<phmap::priv::map_params<long,long,phmap::Less<long>,std::allocator<std::pair<long_const,long>>,256,true>>
::insert_hint_multi<std::pair<long_const,long>const&>
          (btree<phmap::priv::map_params<long,long,phmap::Less<long>,std::allocator<std::pair<long_const,long>>,256,true>>
           *this,iterator position,pair<const_long,_long> *v)

{
  key_type *pkVar1;
  uint uVar2;
  ulong uVar3;
  btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_true>_>
  *pbVar4;
  iterator iVar5;
  iterator next;
  btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_true>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>
  local_48;
  btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_true>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>
  local_38;
  
  pbVar4 = position.node;
  uVar2 = position.position;
  local_48.node = pbVar4;
  local_48.position = uVar2;
  if (*(long *)(this + 0x10) == 0) {
LAB_0023e872:
    iVar5 = insert_multi<std::pair<long_const,long>const&>
                      ((btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_true>_>
                        *)this,v);
  }
  else {
    iVar5 = btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_true>_>
            ::end((btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_true>_>
                   *)this);
    if (iVar5.node == pbVar4 && iVar5.position == uVar2) {
LAB_0023e835:
      local_38._8_8_ = CONCAT44(local_48._12_4_,local_48.position);
      local_38.node = local_48.node;
      iVar5 = btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_true>_>
              ::begin((btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_true>_>
                       *)this);
      uVar3 = iVar5._8_8_;
      if ((local_48.node != iVar5.node) ||
         (pbVar4 = local_48.node, local_48.position != iVar5.position)) {
        btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_true>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>
        ::decrement(&local_38);
        pkVar1 = btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_true>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>
                 ::key(&local_38);
        if (v->first < *pkVar1) goto LAB_0023e872;
        uVar3 = (ulong)(uint)local_48.position;
        pbVar4 = local_48.node;
      }
    }
    else {
      pkVar1 = btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_true>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>
               ::key(&local_48);
      if (v->first <= *pkVar1) goto LAB_0023e835;
      local_38._8_8_ = CONCAT44(local_48._12_4_,local_48.position);
      local_38.node = local_48.node;
      btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_true>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>
      ::increment(&local_38);
      iVar5 = btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_true>_>
              ::end((btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_true>_>
                     *)this);
      uVar3 = iVar5._8_8_;
      if ((local_38.node != iVar5.node) ||
         (pbVar4 = local_38.node, local_38.position != iVar5.position)) {
        pkVar1 = btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_true>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>
                 ::key(&local_38);
        if (*pkVar1 < v->first) goto LAB_0023e872;
        uVar3 = local_38._8_8_ & 0xffffffff;
        pbVar4 = local_38.node;
      }
    }
    iVar5._8_8_ = uVar3;
    iVar5.node = pbVar4;
    iVar5 = internal_emplace<std::pair<long_const,long>const&>(this,iVar5,v);
  }
  return iVar5;
}

Assistant:

auto btree<P>::insert_hint_multi(iterator position, ValueType &&v) -> iterator {
        if (!empty()) {
            const key_type &key = params_type::key(v);
            if (position == end() || !compare_keys(position.key(), key)) {
                iterator prev = position;
                if (position == begin() || !compare_keys(key, (--prev).key())) {
                    // prev.key() <= key <= position.key()
                    return internal_emplace(position, std::forward<ValueType>(v));
                }
            } else {
                iterator next = position;
                ++next;
                if (next == end() || !compare_keys(next.key(), key)) {
                    // position.key() < key <= next.key()
                    return internal_emplace(next, std::forward<ValueType>(v));
                }
            }
        }
        return insert_multi(std::forward<ValueType>(v));
    }